

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

int MuxImageFinalize(WebPMuxImage *wpi)

{
  uint32_t *data_size;
  uint uVar1;
  int iVar2;
  int *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int ok;
  int vp8l_has_alpha;
  int h;
  int w;
  int is_lossless;
  WebPData *image;
  WebPChunk *img;
  bool local_31;
  int iVar3;
  uint in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  data_size = *(uint32_t **)(in_RDI + 4);
  uVar1 = (uint)(*data_size == 0x4c385056);
  iVar3 = 0;
  if (uVar1 == 0) {
    iVar2 = VP8GetInfo((uint8_t *)in_RDI,(size_t)data_size,(size_t)(data_size + 2),
                       (int *)(ulong)CONCAT14(*data_size == 0x4c385056,in_stack_ffffffffffffffe0),
                       (int *)((ulong)in_stack_ffffffffffffffdc << 0x20));
  }
  else {
    iVar2 = VP8LGetInfo(_w,_vp8l_has_alpha,in_stack_00000008,unaff_retaddr,in_RDI);
  }
  if (iVar2 != 0) {
    if ((uVar1 != 0) && (*(long *)(in_RDI + 2) != 0)) {
      ChunkDelete((WebPChunk *)CONCAT44(iVar2,iVar2));
      in_RDI[2] = 0;
      in_RDI[3] = 0;
    }
    in_RDI[8] = in_stack_ffffffffffffffe0;
    in_RDI[9] = in_stack_ffffffffffffffdc;
    local_31 = true;
    if (iVar3 == 0) {
      local_31 = *(long *)(in_RDI + 2) != 0;
    }
    in_RDI[10] = (uint)local_31;
  }
  return iVar2;
}

Assistant:

int MuxImageFinalize(WebPMuxImage* const wpi) {
  const WebPChunk* const img = wpi->img_;
  const WebPData* const image = &img->data_;
  const int is_lossless = (img->tag_ == kChunks[IDX_VP8L].tag);
  int w, h;
  int vp8l_has_alpha = 0;
  const int ok = is_lossless ?
      VP8LGetInfo(image->bytes, image->size, &w, &h, &vp8l_has_alpha) :
      VP8GetInfo(image->bytes, image->size, image->size, &w, &h);
  assert(img != NULL);
  if (ok) {
    // Ignore ALPH chunk accompanying VP8L.
    if (is_lossless && (wpi->alpha_ != NULL)) {
      ChunkDelete(wpi->alpha_);
      wpi->alpha_ = NULL;
    }
    wpi->width_ = w;
    wpi->height_ = h;
    wpi->has_alpha_ = vp8l_has_alpha || (wpi->alpha_ != NULL);
  }
  return ok;
}